

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_f32__pcm(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  ushort uVar1;
  size_t i;
  drwav_uint64 dVar2;
  ulong uVar3;
  drwav_uint64 dVar4;
  short sVar5;
  size_t i_1;
  ulong uVar6;
  byte *pbVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  drwav_uint64 dVar11;
  float fVar12;
  uchar sampleData [4096];
  byte local_1038 [4104];
  
  if ((pWav->bytesPerSample == 0) || (samplesToRead == 0)) {
    dVar11 = 0;
  }
  else {
    dVar11 = 0;
    do {
      uVar3 = (ulong)(0x1000 / pWav->bytesPerSample);
      if (samplesToRead < uVar3) {
        uVar3 = samplesToRead;
      }
      dVar2 = drwav_read(pWav,uVar3,local_1038);
      if (dVar2 == 0) {
        return dVar11;
      }
      uVar1 = pWav->bytesPerSample;
      uVar3 = (ulong)uVar1;
      switch(uVar1) {
      case 1:
        if (pBufferOut != (float *)0x0) {
          dVar4 = 0;
          do {
            pBufferOut[dVar4] =
                 (float)local_1038[dVar4] / 255.0 + (float)local_1038[dVar4] / 255.0 + -1.0;
            dVar4 = dVar4 + 1;
          } while (dVar2 != dVar4);
        }
        break;
      case 2:
        if (pBufferOut != (float *)0x0) {
          dVar4 = 0;
          do {
            pBufferOut[dVar4] = (float)(int)*(short *)(local_1038 + dVar4 * 2) * 3.0517578e-05;
            dVar4 = dVar4 + 1;
          } while (dVar2 != dVar4);
        }
        break;
      case 3:
        if (pBufferOut != (float *)0x0) {
          pbVar7 = local_1038 + 2;
          dVar4 = 0;
          do {
            pBufferOut[dVar4] =
                 (float)(int)((uint)*pbVar7 << 0x18 | (uint)*(ushort *)(pbVar7 + -2) << 8) *
                 4.656613e-10;
            dVar4 = dVar4 + 1;
            pbVar7 = pbVar7 + 3;
          } while (dVar2 != dVar4);
        }
        break;
      case 4:
        if (pBufferOut != (float *)0x0) {
          dVar4 = 0;
          do {
            pBufferOut[dVar4] = (float)*(int *)(local_1038 + dVar4 * 4) * 4.656613e-10;
            dVar4 = dVar4 + 1;
          } while (dVar2 != dVar4);
        }
        break;
      default:
        if (uVar1 < 9) {
          uVar6 = 0;
          pbVar7 = local_1038;
          pfVar8 = pBufferOut;
          do {
            if (uVar3 == 0) {
              fVar12 = 0.0;
            }
            else {
              uVar10 = 0;
              uVar9 = 0;
              sVar5 = uVar1 * -8 + 0x40;
              do {
                uVar9 = uVar9 | (ulong)pbVar7[uVar10] << ((byte)sVar5 & 0x3f);
                sVar5 = sVar5 + 8;
                uVar10 = uVar10 + 1;
              } while (uVar3 != uVar10);
              fVar12 = (float)((double)(long)uVar9 * 1.0842021724855044e-19);
            }
            *pfVar8 = fVar12;
            pfVar8 = pfVar8 + 1;
            uVar6 = (ulong)((int)uVar6 + 1);
            pbVar7 = pbVar7 + uVar3;
          } while (uVar6 < dVar2);
        }
        else {
          memset(pBufferOut,0,dVar2 * 4);
        }
      }
      pBufferOut = pBufferOut + dVar2;
      dVar11 = dVar11 + dVar2;
      samplesToRead = samplesToRead - dVar2;
    } while (samplesToRead != 0);
  }
  return dVar11;
}

Assistant:

drwav_uint64 drwav_read_f32__pcm(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut) {
    if (pWav->bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__pcm_to_f32(pBufferOut, sampleData, (size_t)samplesRead, pWav->bytesPerSample);
        pBufferOut += samplesRead;

        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}